

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter_Geometry.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::ParseNode_Volume(AMFImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  CAMFImporter_NodeElement_Volume *this_00;
  allocator<char> local_1d9;
  string local_1d8;
  allocator<char> local_1b1;
  string local_1b0;
  allocator<char> local_189;
  string local_188;
  allocator<char> local_161;
  string local_160;
  allocator<char> local_139;
  string local_138;
  allocator<char> local_111;
  string local_110;
  allocator<char> local_e9;
  string local_e8;
  allocator<char> local_c1;
  string local_c0;
  byte local_9a;
  byte local_99;
  undefined4 local_98;
  bool close_found;
  bool col_read;
  undefined1 local_90 [8];
  string an;
  uint local_5c;
  int idx_end;
  int idx;
  CAMFImporter_NodeElement *ne;
  string type;
  string materialid;
  AMFImporter *this_local;
  
  std::__cxx11::string::string((string *)(type.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&ne);
  local_5c = 0;
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  for (; (int)local_5c < iVar2; local_5c = local_5c + 1) {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,(ulong)local_5c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,(char *)CONCAT44(extraout_var,iVar3),(allocator<char> *)&col_read)
    ;
    std::allocator<char>::~allocator((allocator<char> *)&col_read);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_90,"materialid");
    if (bVar1) {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_5c);
      std::__cxx11::string::operator=
                ((string *)(type.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_00,iVar3));
      local_98 = 4;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_90,"type");
      if (bVar1) {
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_5c);
        std::__cxx11::string::operator=((string *)&ne,(char *)CONCAT44(extraout_var_01,iVar3));
        local_98 = 4;
      }
      else {
        Throw_IncorrectAttr(this,(string *)local_90);
        local_98 = 0;
      }
    }
    std::__cxx11::string::~string((string *)local_90);
  }
  this_00 = (CAMFImporter_NodeElement_Volume *)operator_new(0x90);
  CAMFImporter_NodeElement_Volume::CAMFImporter_NodeElement_Volume(this_00,this->mNodeElement_Cur);
  _idx_end = this_00;
  std::__cxx11::string::operator=
            ((string *)&this_00->MaterialID,(string *)(type.field_2._M_local_buf + 8));
  std::__cxx11::string::operator=((string *)&_idx_end->Type,(string *)&ne);
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar4 & 1) == 0) {
    local_99 = 0;
    ParseHelper_Node_Enter(this,&_idx_end->super_CAMFImporter_NodeElement);
    local_9a = 0;
    do {
      do {
        while( true ) {
          uVar4 = (*this->mReader->_vptr_IIrrXMLReader[2])();
          if ((uVar4 & 1) == 0) goto LAB_005c88e3;
          iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar2 != 1) break;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"color",&local_c1);
          bVar1 = XML_CheckNode_NameEqual(this,&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
          std::allocator<char>::~allocator(&local_c1);
          if (bVar1) {
            if ((local_99 & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_e8,"color",&local_e9);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_110,"Only one color can be defined for <volume>.",
                         &local_111);
              Throw_MoreThanOnceDefined(this,&local_e8,&local_110);
              std::__cxx11::string::~string((string *)&local_110);
              std::allocator<char>::~allocator(&local_111);
              std::__cxx11::string::~string((string *)&local_e8);
              std::allocator<char>::~allocator(&local_e9);
            }
            ParseNode_Color(this);
            local_99 = 1;
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_138,"triangle",&local_139);
            bVar1 = XML_CheckNode_NameEqual(this,&local_138);
            std::__cxx11::string::~string((string *)&local_138);
            std::allocator<char>::~allocator(&local_139);
            if (bVar1) {
              ParseNode_Triangle(this);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_160,"metadata",&local_161);
              bVar1 = XML_CheckNode_NameEqual(this,&local_160);
              std::__cxx11::string::~string((string *)&local_160);
              std::allocator<char>::~allocator(&local_161);
              if (bVar1) {
                ParseNode_Metadata(this);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_188,"volume",&local_189);
                XML_CheckNode_SkipUnsupported(this,&local_188);
                std::__cxx11::string::~string((string *)&local_188);
                std::allocator<char>::~allocator(&local_189);
              }
            }
          }
        }
        iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      } while (iVar2 != 2);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"volume",&local_1b1);
      bVar1 = XML_CheckNode_NameEqual(this,&local_1b0);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator(&local_1b1);
    } while (!bVar1);
    local_9a = 1;
LAB_005c88e3:
    if ((local_9a & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"volume",&local_1d9);
      Throw_CloseNotFound(this,&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
      std::allocator<char>::~allocator(&local_1d9);
    }
    ParseHelper_Node_Exit(this);
  }
  else {
    std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
    push_back(&this->mNodeElement_Cur->Child,(value_type *)&idx_end);
  }
  std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
  push_back(&this->mNodeElement_List,(value_type *)&idx_end);
  std::__cxx11::string::~string((string *)&ne);
  std::__cxx11::string::~string((string *)(type.field_2._M_local_buf + 8));
  return;
}

Assistant:

void AMFImporter::ParseNode_Volume()
{
std::string materialid;
std::string type;
CAMFImporter_NodeElement* ne;

	// Read attributes for node <color>.
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("materialid", materialid, mReader->getAttributeValue);
		MACRO_ATTRREAD_CHECK_RET("type", type, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;

	// create new object.
	ne = new CAMFImporter_NodeElement_Volume(mNodeElement_Cur);
	// and assign read data
	((CAMFImporter_NodeElement_Volume*)ne)->MaterialID = materialid;
	((CAMFImporter_NodeElement_Volume*)ne)->Type = type;
	// Check for child nodes
	if(!mReader->isEmptyElement())
	{
		bool col_read = false;

		ParseHelper_Node_Enter(ne);
		MACRO_NODECHECK_LOOPBEGIN("volume");
			if(XML_CheckNode_NameEqual("color"))
			{
				// Check if data already defined.
				if(col_read) Throw_MoreThanOnceDefined("color", "Only one color can be defined for <volume>.");
				// read data and set flag about it
				ParseNode_Color();
				col_read = true;

				continue;
			}

			if(XML_CheckNode_NameEqual("triangle")) { ParseNode_Triangle(); continue; }
			if(XML_CheckNode_NameEqual("metadata")) { ParseNode_Metadata(); continue; }
		MACRO_NODECHECK_LOOPEND("volume");
		ParseHelper_Node_Exit();
	}// if(!mReader->isEmptyElement())
	else
	{
		mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	}// if(!mReader->isEmptyElement()) else

	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}